

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

HistoryEpochPtr __thiscall
libcellml::createHistoryEpoch
          (libcellml *this,ComponentConstPtr *component,string *sourceUrl,string *destinationUrl)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  HistoryEpochPtr HVar3;
  ImportedEntityConstPtr local_30;
  
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libcellml::HistoryEpoch,std::allocator<libcellml::HistoryEpoch>,std::shared_ptr<libcellml::Component_const>const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(HistoryEpoch **)this,
             (allocator<libcellml::HistoryEpoch> *)&local_30,component,sourceUrl,destinationUrl);
  _Var2._M_pi = extraout_RDX;
  if (destinationUrl->_M_string_length == 0) {
    peVar1 = (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    local_30.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = &peVar1->super_ImportedEntity;
    if (peVar1 == (element_type *)0x0) {
      local_30.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
    }
    local_30.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (component->super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_30.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_30.
              super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_30.
              super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    recordUrl((HistoryEpochPtr *)this,&local_30);
    _Var2._M_pi = extraout_RDX_00;
    if (local_30.super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.
                 super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var2._M_pi = extraout_RDX_01;
    }
  }
  HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (HistoryEpochPtr)
         HVar3.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

HistoryEpochPtr createHistoryEpoch(const ComponentConstPtr &component, const std::string &sourceUrl, const std::string &destinationUrl)
{
    auto h = std::make_shared<HistoryEpoch>(component, sourceUrl, destinationUrl);
    if (destinationUrl.empty()) {
        recordUrl(h, component);
    }
    return h;
}